

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O3

int gray_conic_to(SW_FT_Vector *control,SW_FT_Vector *to,gray_PWorker worker)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  SW_FT_Pos to_x;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  SW_FT_Vector *pSVar14;
  
  lVar9 = to->y;
  pSVar14 = worker->bez_stack;
  to_x = to->x * 4;
  worker->bez_stack[0].x = to_x;
  lVar6 = lVar9 * 4;
  worker->bez_stack[0].y = lVar6;
  lVar10 = control->x;
  worker->bez_stack[1].x = lVar10 * 4;
  lVar1 = control->y;
  lVar11 = lVar1 * 4;
  worker->bez_stack[1].y = lVar11;
  lVar2 = worker->y;
  uVar12 = to_x + lVar10 * -8 + worker->x;
  uVar8 = -uVar12;
  if (0 < (long)uVar12) {
    uVar8 = uVar12;
  }
  uVar13 = lVar6 + lVar1 * -8 + lVar2;
  uVar12 = -uVar13;
  if (0 < (long)uVar13) {
    uVar12 = uVar13;
  }
  if (uVar12 < uVar8) {
    uVar12 = uVar8;
  }
  worker->bez_stack[2].x = worker->x;
  worker->bez_stack[2].y = lVar2;
  uVar7 = 0;
  if (uVar12 < 0x40) goto LAB_00109d32;
  lVar10 = lVar6;
  if (lVar11 < lVar6) {
    lVar10 = lVar11;
  }
  if (lVar2 < lVar10) {
    lVar10 = lVar2;
  }
  if (worker->max_ey <= lVar10 >> 8) goto LAB_00109d32;
  if (lVar11 + lVar9 * -4 != 0 && lVar6 <= lVar11) {
    lVar6 = lVar11;
  }
  if (lVar6 < lVar2) {
    lVar6 = lVar2;
  }
  if (lVar6 >> 8 < worker->min_ey) goto LAB_00109d32;
  iVar5 = -1;
  do {
    iVar4 = iVar5;
    iVar5 = iVar4 + 1;
    bVar3 = 0x103 < uVar12;
    uVar12 = uVar12 >> 2;
  } while (bVar3);
  worker->lev_stack[0] = iVar4 + 2;
  uVar8 = 0;
  do {
    pSVar14[4].x = pSVar14[2].x;
    lVar11 = pSVar14[1].y;
    lVar9 = to_x + pSVar14[1].x;
    lVar10 = pSVar14[1].x + pSVar14[2].x;
    pSVar14[3].x = lVar10 >> 1;
    pSVar14[2].x = lVar9 + lVar10 >> 2;
    pSVar14[1].x = lVar9 >> 1;
    pSVar14[4].y = pSVar14[2].y;
    lVar9 = pSVar14->y + lVar11;
    lVar11 = lVar11 + pSVar14[2].y;
    pSVar14[3].y = lVar11 >> 1;
    pSVar14[2].y = lVar9 + lVar11 >> 2;
    pSVar14[1].y = lVar9 >> 1;
    pSVar14 = pSVar14 + 2;
    uVar7 = (int)uVar8 + 1;
    worker->lev_stack[uVar8] = iVar5;
    worker->lev_stack[uVar8 + 1] = iVar5;
    while( true ) {
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 0) {
        return 0;
      }
      to_x = pSVar14->x;
      if (0 < worker->lev_stack[uVar8]) break;
LAB_00109d32:
      gray_render_line(worker,to_x,pSVar14->y);
      uVar7 = uVar7 - 1;
      pSVar14 = pSVar14 + -2;
    }
    iVar5 = worker->lev_stack[uVar8] + -1;
  } while( true );
}

Assistant:

static int gray_conic_to(const SW_FT_Vector* control, const SW_FT_Vector* to,
                         gray_PWorker worker)
{
    gray_render_conic(RAS_VAR_ control, to);
    return 0;
}